

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

_func_void * __thiscall
boost::ext::ut::v1_1_8::detail::test::operator=<>(test *this,test_location<void_(*)()> test)

{
  _func_void *in_stack_00000008;
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  *in_stack_ffffffffffffffc8;
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  *in_stack_ffffffffffffffd0;
  test<void_(*)(),_boost::ext::ut::v1_1_8::none> *in_stack_ffffffffffffffe0;
  
  std::
  vector<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ::vector(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  on<,boost::ext::ut::v1_1_8::events::test<void(*)(),boost::ext::ut::v1_1_8::none>>
            (in_stack_ffffffffffffffe0);
  events::test<void_(*)(),_boost::ext::ut::v1_1_8::none>::~test
            ((test<void_(*)(),_boost::ext::ut::v1_1_8::none> *)0x10f056);
  return in_stack_00000008;
}

Assistant:

constexpr auto operator=(test_location<void (*)()> test) {
      on<Ts...>(events::test<void (*)()>{.type = type,
                                         .name = name,
                                         .tag = tag,
                                         .location = test.location,
                                         .arg = none{},
                                         .run = test.test});
      return test.test;
    }